

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ruleiter.cpp
# Opt level: O2

UChar32 __thiscall
icu_63::RuleCharacterIterator::next
          (RuleCharacterIterator *this,int32_t options,UBool *isEscaped,UErrorCode *ec)

{
  short sVar1;
  SymbolTable *pSVar2;
  UBool UVar3;
  uint uVar4;
  undefined4 uVar5;
  int iVar6;
  undefined4 extraout_var;
  int32_t offset;
  UBool *local_78;
  UnicodeString name;
  UnicodeString *pUVar7;
  
  uVar4 = 0xffffffff;
  if (*ec < U_ILLEGAL_ARGUMENT_ERROR) {
    *isEscaped = '\0';
    local_78 = isEscaped;
    do {
      while( true ) {
        uVar4 = _current(this);
        _advance(this,2 - (uint)(uVar4 < 0x10000));
        if ((((uVar4 != 0x24) || ((options & 1U) == 0)) || (this->buf != (UnicodeString *)0x0)) ||
           (pSVar2 = this->sym, pSVar2 == (SymbolTable *)0x0)) break;
        pUVar7 = this->text;
        sVar1 = (pUVar7->fUnion).fStackFields.fLengthAndFlags;
        if (sVar1 < 0) {
          uVar4 = (pUVar7->fUnion).fFields.fLength;
        }
        else {
          uVar4 = (int)sVar1 >> 5;
        }
        (*pSVar2->_vptr_SymbolTable[4])(&name,pSVar2,pUVar7,this->pos,(ulong)uVar4);
        uVar5 = name.fUnion.fFields.fLength;
        if (-1 < name.fUnion.fStackFields.fLengthAndFlags) {
          uVar5 = (int)name.fUnion.fStackFields.fLengthAndFlags >> 5;
        }
        if (uVar5 == 0) {
          UnicodeString::~UnicodeString(&name);
          return 0x24;
        }
        this->bufPos = 0;
        iVar6 = (*this->sym->_vptr_SymbolTable[2])(this->sym,&name);
        pUVar7 = (UnicodeString *)CONCAT44(extraout_var,iVar6);
        this->buf = pUVar7;
        if (pUVar7 == (UnicodeString *)0x0) {
          *ec = U_UNDEFINED_VARIABLE;
          goto LAB_001a6411;
        }
        sVar1 = (pUVar7->fUnion).fStackFields.fLengthAndFlags;
        if (sVar1 < 0) {
          iVar6 = (pUVar7->fUnion).fFields.fLength;
        }
        else {
          iVar6 = (int)sVar1 >> 5;
        }
        if (iVar6 == 0) {
          this->buf = (UnicodeString *)0x0;
        }
        UnicodeString::~UnicodeString(&name);
      }
    } while (((options & 4U) != 0) && (UVar3 = PatternProps::isWhiteSpace(uVar4), UVar3 != '\0'));
    if (uVar4 == 0x5c) {
      if ((options & 2U) == 0) {
        uVar4 = 0x5c;
      }
      else {
        name.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_00245838;
        name.fUnion.fStackFields.fLengthAndFlags = 2;
        offset = 0;
        lookahead(this,&name,0xc);
        uVar4 = UnicodeString::unescapeAt(&name,&offset);
        _advance(this,offset);
        *local_78 = '\x01';
        if ((int)uVar4 < 0) {
          *ec = U_MALFORMED_UNICODE_ESCAPE;
LAB_001a6411:
          UnicodeString::~UnicodeString(&name);
          uVar4 = 0xffffffff;
        }
        else {
          UnicodeString::~UnicodeString(&name);
        }
      }
    }
  }
  return uVar4;
}

Assistant:

UChar32 RuleCharacterIterator::next(int32_t options, UBool& isEscaped, UErrorCode& ec) {
    if (U_FAILURE(ec)) return DONE;

    UChar32 c = DONE;
    isEscaped = FALSE;

    for (;;) {
        c = _current();
        _advance(U16_LENGTH(c));

        if (c == SymbolTable::SYMBOL_REF && buf == 0 &&
            (options & PARSE_VARIABLES) != 0 && sym != 0) {
            UnicodeString name = sym->parseReference(text, pos, text.length());
            // If name is empty there was an isolated SYMBOL_REF;
            // return it.  Caller must be prepared for this.
            if (name.length() == 0) {
                break;
            }
            bufPos = 0;
            buf = sym->lookup(name);
            if (buf == 0) {
                ec = U_UNDEFINED_VARIABLE;
                return DONE;
            }
            // Handle empty variable value
            if (buf->length() == 0) {
                buf = 0;
            }
            continue;
        }

        if ((options & SKIP_WHITESPACE) != 0 && PatternProps::isWhiteSpace(c)) {
            continue;
        }

        if (c == 0x5C /*'\\'*/ && (options & PARSE_ESCAPES) != 0) {
            UnicodeString tempEscape;
            int32_t offset = 0;
            c = lookahead(tempEscape, MAX_U_NOTATION_LEN).unescapeAt(offset);
            jumpahead(offset);
            isEscaped = TRUE;
            if (c < 0) {
                ec = U_MALFORMED_UNICODE_ESCAPE;
                return DONE;
            }
        }

        break;
    }

    return c;
}